

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

matches * atomctarg(disctx *ctx,ull *a,ull *m,void *v,int spos)

{
  matches *pmVar1;
  expr *peVar2;
  ull uVar3;
  char *pcVar4;
  expr **ppeVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  
  if (ctx->reverse != 0) {
    pmVar1 = matchimm(ctx,(bitfield *)v,spos);
    return pmVar1;
  }
  peVar2 = (expr *)calloc(0x48,1);
  uVar3 = getbf((bitfield *)v,a,m,ctx);
  peVar2->num1 = uVar3;
  uVar6 = ctx->codebase;
  uVar10 = (uint)uVar3;
  if ((uVar6 <= uVar10) && (uVar10 < ctx->codesz / (uint)ctx->isa->posunit + uVar6)) {
    ctx->marks[uVar10 - uVar6] = ctx->marks[uVar10 - uVar6] | 2;
    uVar6 = ctx->codebase;
  }
  if (((uVar6 <= uVar10) && (uVar10 < ctx->codesz / (uint)ctx->isa->posunit + uVar6)) &&
     ((*(byte *)(ctx->marks + (uVar10 - uVar6)) & 0x40) != 0)) {
    ctx->endmark = 1;
  }
  peVar2->special = 2;
  iVar7 = ctx->atomsnum;
  iVar8 = ctx->atomsmax;
  if (iVar7 < iVar8) {
    ppeVar5 = ctx->atoms;
  }
  else {
    iVar7 = 0x10;
    if (iVar8 != 0) {
      iVar7 = iVar8 * 2;
    }
    ctx->atomsmax = iVar7;
    ppeVar5 = (expr **)realloc(ctx->atoms,(long)iVar7 << 3);
    ctx->atoms = ppeVar5;
    iVar7 = ctx->atomsnum;
  }
  iVar8 = iVar7 + 1;
  ctx->atomsnum = iVar8;
  ppeVar5[iVar7] = peVar2;
  if (0 < (long)ctx->labelsnum) {
    lVar9 = 0;
    do {
      if ((*(ull *)((long)&ctx->labels->val + lVar9) == uVar3) &&
         (pcVar4 = *(char **)((long)&ctx->labels->name + lVar9), pcVar4 != (char *)0x0)) {
        peVar2 = (expr *)calloc(0x48,1);
        peVar2->type = EXPR_LABEL;
        pcVar4 = strdup(pcVar4);
        peVar2->str = pcVar4;
        peVar2->special = 2;
        iVar7 = ctx->atomsmax;
        ppeVar5 = ctx->atoms;
        if (iVar7 <= iVar8) {
          iVar8 = 0x10;
          if (iVar7 != 0) {
            iVar8 = iVar7 * 2;
          }
          ctx->atomsmax = iVar8;
          ppeVar5 = (expr **)realloc(ppeVar5,(long)iVar8 << 3);
          ctx->atoms = ppeVar5;
          iVar8 = ctx->atomsnum;
        }
        ctx->atomsnum = iVar8 + 1;
        ppeVar5[iVar8] = peVar2;
        return (matches *)0x0;
      }
      lVar9 = lVar9 + 0x18;
    } while ((long)ctx->labelsnum * 0x18 != lVar9);
  }
  return (matches *)0x0;
}

Assistant:

struct matches *atomctarg APROTO {
	const struct bitfield *bf = v;
	if (ctx->reverse)
		return matchimm(ctx, bf, spos);
	struct expr *expr = makeex(EXPR_NUM);
	expr->num1 = GETBF(bf);
	mark(ctx, expr->num1, 2);
	if (is_nr_mark(ctx, expr->num1))
		ctx->endmark = 1;
	expr->special = 2;
	ADDARRAY(ctx->atoms, expr);
	int i;
	for (i = 0; i < ctx->labelsnum; i++) {
		if (ctx->labels[i].val == expr->num1 && ctx->labels[i].name) {
			struct expr *expr = makeex(EXPR_LABEL);
			expr->str = strdup(ctx->labels[i].name);
			expr->special = 2;
			ADDARRAY(ctx->atoms, expr);
			return NULL;
		}
	}
	return NULL;
}